

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O0

void __thiscall
ser::CentralizedFileFormat::Init
          (CentralizedFileFormat *this,string *directory,string *prefix,MetainfoSet *globalMetainfo,
          FieldsTable *fieldsTable,OffsetTable *offsetTable)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  OffsetTable *local_38;
  OffsetTable *offsetTable_local;
  FieldsTable *fieldsTable_local;
  MetainfoSet *globalMetainfo_local;
  string *prefix_local;
  string *directory_local;
  CentralizedFileFormat *this_local;
  
  local_38 = offsetTable;
  offsetTable_local = (OffsetTable *)fieldsTable;
  fieldsTable_local = (FieldsTable *)globalMetainfo;
  globalMetainfo_local = (MetainfoSet *)prefix;
  prefix_local = directory;
  directory_local = (string *)this;
  FileFormat::Init(&this->super_FileFormat,directory,prefix,globalMetainfo,fieldsTable,offsetTable);
  std::operator+(&local_78,&(this->super_FileFormat).directory_,&(this->super_FileFormat).prefix_);
  std::operator+(&local_58,&local_78,".json");
  std::__cxx11::string::operator=((string *)&this->databaseFile_,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void CentralizedFileFormat::Init(const std::string& directory, const std::string& prefix,
                                 MetainfoSet& globalMetainfo, FieldsTable& fieldsTable, OffsetTable& offsetTable)
{
    FileFormat::Init(directory, prefix, globalMetainfo, fieldsTable, offsetTable);
    databaseFile_ = directory_ + prefix_ + ".json";
}